

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  pointer ppvVar1;
  int i;
  ulong uVar2;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_002989e0;
  for (uVar2 = 0;
      ppvVar1 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->files_to_delete_).
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3);
      uVar2 = uVar2 + 1) {
    operator_delete(ppvVar1[uVar2]);
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>);
  SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::~DescriptorIndex
            (&this->index_);
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (int i = 0; i < files_to_delete_.size(); i++) {
    operator delete(files_to_delete_[i]);
  }
}